

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

logical pnga_create_mutexes(Integer num)

{
  int iVar1;
  ulong uVar2;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (num - 0x8001U < 0xffffffffffff8000) {
    uVar2 = 0;
  }
  else {
    if ((ulong)(uint)num_mutexes != 0) {
      pnga_error("mutexes already created",(ulong)(uint)num_mutexes);
    }
    num_mutexes = (int)num;
    uVar2 = 1;
    if (GAnproc != 1) {
      chunk_mutex = (int)((num + GAnproc + -1) / GAnproc);
      iVar1 = chunk_mutex;
      if (num <= GAme * chunk_mutex) {
        iVar1 = 0;
      }
      iVar1 = ARMCI_Create_mutexes(iVar1);
      uVar2 = (ulong)(iVar1 == 0);
    }
  }
  return uVar2;
}

Assistant:

logical pnga_create_mutexes(Integer num)
{
int myshare;

   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if (num <= 0 || num > MAX_MUTEXES) return(FALSE);
   if(num_mutexes) pnga_error("mutexes already created",num_mutexes);

   num_mutexes= (int)num;

   if(GAnproc == 1){
      return(TRUE);
   }
   chunk_mutex = (int)((num + GAnproc-1)/GAnproc);
   if(GAme * chunk_mutex >= num)myshare =0;
   else myshare=chunk_mutex;

   /* need work here to use permutation */
   if(ARMCI_Create_mutexes(myshare)){
      return FALSE;
   }
   return TRUE;
}